

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPrePartialsStates
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          int *states2,float *matrices2,int startPattern,int endPattern)

{
  int *piVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  long lVar17;
  int k;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  iVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
  uVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  iVar16 = startPattern * 4;
  for (uVar19 = 0; uVar19 != (~((int)uVar7 >> 0x1f) & uVar7); uVar19 = uVar19 + 1) {
    lVar20 = (long)iVar16;
    auVar3 = *(undefined1 (*) [16])(matrices1 + uVar19 * 0x14);
    pfVar2 = matrices1 + uVar19 * 0x14 + 5;
    fVar12 = *pfVar2;
    fVar13 = pfVar2[1];
    fVar14 = pfVar2[2];
    fVar15 = pfVar2[3];
    auVar4 = *(undefined1 (*) [16])(matrices1 + uVar19 * 0x14 + 10);
    auVar5 = *(undefined1 (*) [16])(matrices1 + uVar19 * 0x14 + 0xf);
    lVar18 = (long)startPattern;
    while (lVar18 < endPattern) {
      piVar1 = states2 + lVar18;
      lVar18 = lVar18 + 1;
      lVar17 = (long)*piVar1 + (long)((int)uVar19 * 0x14);
      fVar8 = partials1[lVar20 + 1] * matrices2[lVar17 + 5];
      fVar9 = partials1[lVar20] * matrices2[lVar17];
      fVar10 = partials1[lVar20 + 2] * matrices2[lVar17 + 10];
      fVar11 = partials1[lVar20 + 3] * matrices2[lVar17 + 0xf];
      auVar21._4_4_ = fVar9;
      auVar21._0_4_ = fVar9;
      auVar21._8_4_ = fVar9;
      auVar21._12_4_ = fVar9;
      auVar23._0_4_ = fVar12 * fVar8;
      auVar23._4_4_ = fVar13 * fVar8;
      auVar23._8_4_ = fVar14 * fVar8;
      auVar23._12_4_ = fVar15 * fVar8;
      auVar21 = vfmadd213ps_fma(auVar21,auVar3,auVar23);
      auVar24._4_4_ = fVar10;
      auVar24._0_4_ = fVar10;
      auVar24._8_4_ = fVar10;
      auVar24._12_4_ = fVar10;
      auVar21 = vfmadd213ps_fma(auVar24,auVar4,auVar21);
      auVar22._4_4_ = fVar11;
      auVar22._0_4_ = fVar11;
      auVar22._8_4_ = fVar11;
      auVar22._12_4_ = fVar11;
      auVar21 = vfmadd213ps_fma(auVar22,auVar5,auVar21);
      *(undefined1 (*) [16])(destP + lVar20) = auVar21;
      lVar20 = lVar20 + 4;
    }
    iVar16 = iVar16 + iVar6 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const int* states2,
                                                                    const REALTYPE* matrices2,
                                                                    int startPattern,
                                                                    int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
            u += 4*startPattern;
        }
        int w = l*4*OFFSET;


        PREFETCH_MATRIX_TRANSPOSE(1, matrices1, w); //m100, m101, ..., m133
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1, partials1, u); // p10, p11, p12, p13

            const int state2 = states2[k];
            PREFETCH_MATRIX_COLUMN(2, matrices2, w + state2); // sum20, sum21, sum22, sum23

            DO_SCHUR_PRODUCT(1, 1, 2); // reWrites p10, p11, p12, p13

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13

            // Final results
            destP[u] = sum10;
            destP[u + 1] = sum11;
            destP[u + 2] = sum12;
            destP[u + 3] = sum13;

            u += 4;

        }
    }
}